

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmNinjaNormalTargetGenerator::CheckUseResponseFileForLibraries
          (cmNinjaNormalTargetGenerator *this,string *l)

{
  bool bVar1;
  cmValue cVar2;
  cmValue val;
  string responseVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmValue cVar3;
  
  std::operator+(&local_50,"CMAKE_",l);
  std::operator+(&local_30,&local_50,"_USE_RESPONSE_FILE_FOR_LIBRARIES");
  std::__cxx11::string::~string((string *)&local_50);
  cVar2 = cmMakefile::GetDefinition
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                     &local_30);
  cVar3 = cVar2;
  local_50._M_dataplus._M_p = (pointer)cVar2;
  if (cVar2.Value != (string *)0x0) {
    bVar1 = cmValue::IsOn((cmValue *)&local_50);
    cVar3.Value = (string *)(ulong)bVar1;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return (bool)(cVar2.Value == (string *)0x0 | (byte)cVar3.Value & 1);
}

Assistant:

bool cmNinjaNormalTargetGenerator::CheckUseResponseFileForLibraries(
  const std::string& l) const
{
  // Check for an explicit setting one way or the other.
  std::string const responseVar =
    "CMAKE_" + l + "_USE_RESPONSE_FILE_FOR_LIBRARIES";

  // If the option is defined, read it's value
  if (cmValue val = this->Makefile->GetDefinition(responseVar)) {
    return val.IsOn();
  }

  // Default to true
  return true;
}